

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * fmt::v10::detail::
       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char_const*,char_const*,int>&>
                 (char *begin,char *end,
                 format_string_checker<char,_const_char_*,_const_char_*,_int> *handler)

{
  size_t *psVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  char *begin_00;
  id_adapter adapter;
  id_adapter local_28;
  
  begin_00 = begin + 1;
  if (begin_00 == end) {
    throw_format_error("invalid format string");
  }
  cVar2 = *begin_00;
  if (cVar2 != '{') {
    if (cVar2 == '}') {
      uVar4 = compile_parse_context<char>::next_arg_id(&handler->context_);
      pcVar3 = (handler->context_).super_basic_format_parse_context<char>.format_str_.data_;
      (handler->context_).super_basic_format_parse_context<char>.format_str_.data_ = begin_00;
      psVar1 = &(handler->context_).super_basic_format_parse_context<char>.format_str_.size_;
      *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)begin_00));
      if (2 < uVar4) goto LAB_0016acd4;
      uVar5 = (ulong)uVar4;
    }
    else {
      local_28.arg_id = 0;
      local_28.handler = handler;
      if (cVar2 == ':') {
        local_28.arg_id = compile_parse_context<char>::next_arg_id(&handler->context_);
      }
      else {
        begin_00 = do_parse_arg_id<char,fmt::v10::detail::parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char_const*,char_const*,int>&>(char_const*,char_const*,fmt::v10::detail::format_string_checker<char,char_const*,char_const*,int>&)::id_adapter&>
                             (begin_00,end,&local_28);
      }
      if (begin_00 == end) {
LAB_0016acf0:
        throw_format_error("missing \'}\' in format string");
      }
      if (*begin_00 == ':') {
        begin_00 = begin_00 + 1;
        psVar1 = &(handler->context_).super_basic_format_parse_context<char>.format_str_.size_;
        *psVar1 = (size_t)((handler->context_).super_basic_format_parse_context<char>.format_str_.
                           data_ + (*psVar1 - (long)begin_00));
        (handler->context_).super_basic_format_parse_context<char>.format_str_.data_ = begin_00;
        if ((ulong)(uint)local_28.arg_id < 3) {
          begin_00 = (*handler->parse_funcs_[(uint)local_28.arg_id])(&handler->context_);
        }
        if ((begin_00 == end) || (*begin_00 != '}')) {
          throw_format_error("unknown format specifier");
        }
        goto LAB_0016acd4;
      }
      if (*begin_00 != '}') goto LAB_0016acf0;
      uVar5 = (ulong)(uint)local_28.arg_id;
      psVar1 = &(handler->context_).super_basic_format_parse_context<char>.format_str_.size_;
      *psVar1 = (size_t)((handler->context_).super_basic_format_parse_context<char>.format_str_.
                         data_ + (*psVar1 - (long)begin_00));
      (handler->context_).super_basic_format_parse_context<char>.format_str_.data_ = begin_00;
      if (2 < uVar5) goto LAB_0016acd4;
    }
    (*handler->parse_funcs_[uVar5])(&handler->context_);
  }
LAB_0016acd4:
  return begin_00 + 1;
}

Assistant:

FMT_CONSTEXPR auto parse_replacement_field(const Char* begin, const Char* end,
                                           Handler&& handler) -> const Char* {
  struct id_adapter {
    Handler& handler;
    int arg_id;

    FMT_CONSTEXPR void on_auto() { arg_id = handler.on_arg_id(); }
    FMT_CONSTEXPR void on_index(int id) { arg_id = handler.on_arg_id(id); }
    FMT_CONSTEXPR void on_name(basic_string_view<Char> id) {
      arg_id = handler.on_arg_id(id);
    }
  };

  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}